

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O1

Cnf_Dat_t * Cnf_DataReadFromFile(char *pFileName)

{
  uint Entry;
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  FILE *__stream;
  char *__s;
  char *pcVar5;
  Vec_Int_t *p;
  int *piVar6;
  Vec_Int_t *p_00;
  Cnf_Dat_t *pCVar7;
  int **ppiVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    pCVar7 = (Cnf_Dat_t *)0x0;
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
  }
  else {
    __s = (char *)malloc(1000000);
    pcVar5 = fgets(__s,1000000,__stream);
    if (pcVar5 != (char *)0x0) {
      uVar4 = 0xffffffff;
      uVar10 = 0;
      uVar11 = 0xffffffff;
      p_00 = (Vec_Int_t *)0x0;
      p = (Vec_Int_t *)0x0;
LAB_0055c02f:
      uVar3 = (uint)uVar11;
      do {
        uVar10 = uVar10 + 1;
        if (*__s != 'c') {
          if (*__s == 'p') goto LAB_0055c108;
          pcVar5 = strtok(__s," \t\r\n");
          if (pcVar5 != (char *)0x0) {
            Vec_IntPush(p,p_00->nSize);
            do {
              uVar1 = atoi(pcVar5);
              if (uVar1 == 0) goto LAB_0055c0e0;
              if ((int)uVar1 < 1) {
                Entry = ~uVar1 * 2 + 1;
              }
              else {
                Entry = uVar1 * 2 - 2;
              }
              if (SBORROW4(Entry,uVar3 * 2) == (int)(Entry + uVar3 * -2) < 0) {
                printf("Literal %d is out-of-bound for %d variables.\n",(ulong)Entry,uVar11);
                goto LAB_0055c252;
              }
              Vec_IntPush(p_00,Entry);
              pcVar5 = strtok((char *)0x0," \t\r\n");
            } while (pcVar5 != (char *)0x0);
            if (uVar1 != 0) {
              printf("There is no zero-terminator in line %d.\n",(ulong)uVar10);
              goto LAB_0055c252;
            }
          }
        }
LAB_0055c0e0:
        pcVar5 = fgets(__s,1000000,__stream);
        if (pcVar5 == (char *)0x0) goto LAB_0055c27e;
      } while( true );
    }
    uVar3 = 0xffffffff;
    p = (Vec_Int_t *)0x0;
    p_00 = (Vec_Int_t *)0x0;
    uVar4 = 0xffffffff;
LAB_0055c27e:
    if (p->nSize != uVar4) {
      printf("Warning! The number of clauses (%d) is different from declaration (%d).\n");
    }
    Vec_IntPush(p,p_00->nSize);
    pCVar7 = (Cnf_Dat_t *)calloc(1,0x48);
    pCVar7->nVars = uVar3;
    iVar2 = p->nSize;
    pCVar7->nClauses = iVar2 + -1;
    pCVar7->nLiterals = p_00->nSize;
    ppiVar8 = (int **)malloc((long)iVar2 << 3);
    pCVar7->pClauses = ppiVar8;
    piVar6 = p_00->pArray;
    p_00->nCap = 0;
    p_00->nSize = 0;
    p_00->pArray = (int *)0x0;
    *ppiVar8 = piVar6;
    iVar2 = p->nSize;
    if (0 < (long)iVar2) {
      lVar9 = 0;
      do {
        ppiVar8[lVar9] = *ppiVar8 + p->pArray[lVar9];
        lVar9 = lVar9 + 1;
      } while (iVar2 != lVar9);
    }
LAB_0055c310:
    fclose(__stream);
    if (p != (Vec_Int_t *)0x0) {
      if (p->pArray != (int *)0x0) {
        free(p->pArray);
        p->pArray = (int *)0x0;
      }
      free(p);
    }
    if (p_00 != (Vec_Int_t *)0x0) {
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
        p_00->pArray = (int *)0x0;
      }
      free(p_00);
    }
    if (__s != (char *)0x0) {
      free(__s);
    }
  }
  return pCVar7;
LAB_0055c108:
  pcVar5 = strtok(__s + 1," \t");
  iVar2 = strcmp(pcVar5,"cnf");
  if (iVar2 == 0) {
    pcVar5 = strtok((char *)0x0," \t");
    uVar3 = atoi(pcVar5);
    uVar11 = (ulong)uVar3;
    pcVar5 = strtok((char *)0x0," \t");
    uVar4 = atoi(pcVar5);
    if ((0 < (int)uVar3) && (0 < (int)uVar4)) {
      p = (Vec_Int_t *)malloc(0x10);
      uVar1 = uVar4 + 1;
      if (uVar4 < 0xf) {
        uVar1 = 0x10;
      }
      p->nSize = 0;
      p->nCap = uVar1;
      piVar6 = (int *)malloc((ulong)uVar1 << 2);
      p->pArray = piVar6;
      p_00 = (Vec_Int_t *)malloc(0x10);
      uVar1 = uVar4 * 8;
      if (uVar4 * 8 - 1 < 0xf) {
        uVar1 = 0x10;
      }
      p_00->nSize = 0;
      p_00->nCap = uVar1;
      if (uVar1 == 0) {
        piVar6 = (int *)0x0;
      }
      else {
        piVar6 = (int *)malloc((ulong)uVar1 << 2);
      }
      p_00->pArray = piVar6;
      pcVar5 = fgets(__s,1000000,__stream);
      if (pcVar5 == (char *)0x0) goto LAB_0055c27e;
      goto LAB_0055c02f;
    }
    puts("Incorrect parameters.");
  }
  else {
    puts("Incorrect input file.");
  }
LAB_0055c252:
  pCVar7 = (Cnf_Dat_t *)0x0;
  goto LAB_0055c310;
}

Assistant:

Cnf_Dat_t * Cnf_DataReadFromFile( char * pFileName )
{
    int MaxLine = 1000000;
    int Var, Lit, nVars = -1, nClas = -1, i, Entry, iLine = 0;
    Cnf_Dat_t * pCnf = NULL;
    Vec_Int_t * vClas = NULL;
    Vec_Int_t * vLits = NULL;
    char * pBuffer, * pToken;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return NULL;
    }
    pBuffer = ABC_ALLOC( char, MaxLine );
    while ( fgets(pBuffer, MaxLine, pFile) != NULL )
    {
        iLine++;
        if ( pBuffer[0] == 'c' )
            continue;
        if ( pBuffer[0] == 'p' )
        {
            pToken = strtok( pBuffer+1, " \t" );
            if ( strcmp(pToken, "cnf") )
            {
                printf( "Incorrect input file.\n" );
                goto finish;
            }
            pToken = strtok( NULL, " \t" );
            nVars = atoi( pToken );
            pToken = strtok( NULL, " \t" );
            nClas = atoi( pToken );
            if ( nVars <= 0 || nClas <= 0 )
            {
                printf( "Incorrect parameters.\n" );
                goto finish;
            }
            // temp storage
            vClas = Vec_IntAlloc( nClas+1 );
            vLits = Vec_IntAlloc( nClas*8 );
            continue;
        }
        pToken = strtok( pBuffer, " \t\r\n" );
        if ( pToken == NULL )
            continue;
        Vec_IntPush( vClas, Vec_IntSize(vLits) );
        while ( pToken )
        {
            Var = atoi( pToken );
            if ( Var == 0 )
                break;
            Lit = (Var > 0) ? Abc_Var2Lit(Var-1, 0) : Abc_Var2Lit(-Var-1, 1);
            if ( Lit >= 2*nVars )
            {
                printf( "Literal %d is out-of-bound for %d variables.\n", Lit, nVars );
                goto finish;
            }
            Vec_IntPush( vLits, Lit );
            pToken = strtok( NULL, " \t\r\n" );
        }
        if ( Var != 0 )
        {
            printf( "There is no zero-terminator in line %d.\n", iLine );
            goto finish;
        }
    }
    // finalize
    if ( Vec_IntSize(vClas) != nClas )
        printf( "Warning! The number of clauses (%d) is different from declaration (%d).\n", Vec_IntSize(vClas), nClas );
    Vec_IntPush( vClas, Vec_IntSize(vLits) );
    // create
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->nVars     = nVars;
    pCnf->nClauses  = Vec_IntSize(vClas)-1;
    pCnf->nLiterals = Vec_IntSize(vLits);
    pCnf->pClauses  = ABC_ALLOC( int *, Vec_IntSize(vClas) );
    pCnf->pClauses[0] = Vec_IntReleaseArray(vLits);
    Vec_IntForEachEntry( vClas, Entry, i )
        pCnf->pClauses[i] = pCnf->pClauses[0] + Entry;
finish:
    fclose( pFile );
    Vec_IntFreeP( &vClas );
    Vec_IntFreeP( &vLits );
    ABC_FREE( pBuffer );
    return pCnf;
}